

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O3

void read_calendar_date(calendar_date_t *record,int field_count,char **field_names,
                       char **field_values)

{
  char cVar1;
  int iVar2;
  exception_type_t eVar3;
  char *pcVar4;
  calendar_date_t *__dest;
  ulong uVar5;
  
  record->service_id[0] = '\0';
  record->date[0] = '\0';
  record->exception_type = ET_NOT_SET;
  if (0 < field_count) {
    uVar5 = 0;
    do {
      pcVar4 = field_names[uVar5];
      iVar2 = strcmp(pcVar4,"service_id");
      if (iVar2 == 0) {
        pcVar4 = field_values[uVar5];
        __dest = record;
LAB_00125848:
        strcpy(__dest->service_id,pcVar4);
      }
      else {
        iVar2 = strcmp(pcVar4,"date");
        if (iVar2 == 0) {
          pcVar4 = field_values[uVar5];
          __dest = (calendar_date_t *)record->date;
          goto LAB_00125848;
        }
        iVar2 = strcmp(pcVar4,"exception_type");
        if (iVar2 == 0) {
          cVar1 = *field_values[uVar5];
          if (cVar1 == '1') {
            eVar3 = ET_ADDED;
LAB_0012585c:
            if (field_values[uVar5][1] != '\0') {
              eVar3 = ET_NOT_SET;
            }
          }
          else {
            eVar3 = ET_NOT_SET;
            if (cVar1 == '2') {
              eVar3 = ET_REMOVED;
              goto LAB_0012585c;
            }
          }
          record->exception_type = eVar3;
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uint)field_count != uVar5);
  }
  return;
}

Assistant:

void read_calendar_date(calendar_date_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_date(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "date") == 0) {
            strcpy(record->date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "exception_type") == 0) {
            record->exception_type = parse_exception_type(field_values[i]);
            continue;
        }
    }
}